

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBFArrayBox.cpp
# Opt level: O0

FArrayBox * __thiscall amrex::EBFArrayBox::getVolFracData(EBFArrayBox *this)

{
  FabArray<amrex::FArrayBox> *in_RDI;
  MultiFab *mf;
  int in_stack_ffffffffffffffdc;
  FArrayBox *local_8;
  
  if (((in_RDI->super_FabArrayBase).boxarray.m_ref.
       super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0)
     || (*(int *)&(in_RDI->super_FabArrayBase).boxarray.m_ref.
                  super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi < 0
        )) {
    local_8 = (FArrayBox *)0x0;
  }
  else {
    EBFArrayBoxFactory::getVolFrac((EBFArrayBoxFactory *)in_RDI);
    local_8 = FabArray<amrex::FArrayBox>::operator[](in_RDI,in_stack_ffffffffffffffdc);
  }
  return local_8;
}

Assistant:

const FArrayBox*
EBFArrayBox::getVolFracData () const
{
    if (m_factory && m_box_index >= 0) {
        MultiFab const& mf = m_factory->getVolFrac();
        return &(mf[m_box_index]);
    } else {
        return nullptr;
    }
}